

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

SafeIntError DivisionHelper<long,_int,_5>::Divide(long *t,int *u,long *result)

{
  long lVar1;
  long lVar2;
  long *in_RDX;
  int *in_RSI;
  long *in_RDI;
  undefined4 local_4;
  
  if (*in_RSI == 0) {
    local_4 = SafeIntDivideByZero;
  }
  else if (*in_RDI == 0) {
    *in_RDX = 0;
    local_4 = SafeIntNoError;
  }
  else {
    lVar1 = *in_RDI;
    lVar2 = std::numeric_limits<long>::min();
    if ((lVar1 == lVar2) && (*in_RSI == -1)) {
      local_4 = SafeIntArithmeticOverflow;
    }
    else {
      *in_RDX = *in_RDI / (long)*in_RSI;
      local_4 = SafeIntNoError;
    }
  }
  return local_4;
}

Assistant:

static SafeIntError Divide( const T& t, const U& u, T& result ) SAFEINT_NOTHROW
    {
        if( u == 0 )
        {
            return SafeIntDivideByZero;
        }

        if( t == 0 )
        {
            result = 0;
            return SafeIntNoError;
        }

        // Must test for corner case
        if( t == std::numeric_limits<T>::min() && u == (U)-1 )
            return SafeIntArithmeticOverflow;

        result = (T)( t/u );
        return SafeIntNoError;
    }